

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O3

uint64_t absl::lts_20240722::log_internal::anon_unknown_1::DecodeVarint(Span<const_char> *buf)

{
  byte *pbVar1;
  uint64_t uVar2;
  uint64_t extraout_RAX;
  byte bVar3;
  ulong extraout_RDX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = buf->len_;
  bVar3 = 0;
  uVar2 = 0;
  uVar5 = 0;
  do {
    uVar6 = uVar4;
    if (uVar4 == uVar5) goto LAB_0010193a;
    pbVar1 = (byte *)(buf->ptr_ + uVar5);
    uVar2 = uVar2 | (ulong)(*pbVar1 & 0x7f) << (bVar3 & 0x3f);
    uVar5 = uVar5 + 1;
    bVar3 = bVar3 + 7;
  } while ((char)*pbVar1 < '\0');
  uVar6 = uVar5;
  if (uVar4 < uVar5) {
    _GLOBAL__N_1::DecodeVarint();
    uVar2 = extraout_RAX;
    uVar4 = extraout_RDX;
    uVar6 = extraout_RDX;
  }
LAB_0010193a:
  buf->ptr_ = buf->ptr_ + uVar6;
  buf->len_ = uVar4 - uVar6;
  return uVar2;
}

Assistant:

uint64_t DecodeVarint(absl::Span<const char> *buf) {
  uint64_t value = 0;
  size_t s = 0;
  while (s < buf->size()) {
    value |= static_cast<uint64_t>(static_cast<unsigned char>((*buf)[s]) & 0x7f)
             << 7 * s;
    if (!((*buf)[s++] & 0x80)) break;
  }
  buf->remove_prefix(s);
  return value;
}